

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createConeShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btConeShape *this_00;
  btConeShape *local_18;
  
  this_00 = (btConeShape *)btConeShape::operator_new(0x60);
  btConeShape::btConeShape(this_00,radius,height);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_18);
  return (btCollisionShape *)this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createConeShapeY(btScalar radius,btScalar height)
{
	btConeShape* shape = new btConeShape(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}